

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

void __thiscall
TxRequestTracker::Impl::SetTimePoint
          (Impl *this,microseconds now,
          vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *expired)

{
  type *this_00;
  size_type *psVar1;
  pointer ppVar2;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar3;
  pointer poVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  undefined8 uVar7;
  bool bVar8;
  Priority PVar9;
  Priority PVar10;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
  *poVar11;
  __hash_code __code;
  index_node_type *x;
  _Hash_node_base *p_Var12;
  Iter<ByTxHash> IVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  GenTxid local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((expired !=
       (vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *)0x0) &&
     (ppVar2 = (expired->
               super__Vector_base<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (expired->
     super__Vector_base<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_>).
     _M_impl.super__Vector_impl_data._M_finish != ppVar2)) {
    (expired->
    super__Vector_base<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  if ((this->m_index).node_count != 0) {
    this_00 = &(this->m_index).super_type;
    do {
      poVar3 = (this->m_index).
               super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
               .member;
      poVar4 = (poVar3->
               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
               ).
               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
               .
               super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
               .
               super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .
               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .super_type.left_;
      IVar13.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                     *)&poVar4[-3].
                        super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                        .super_type.right_;
      if (poVar4 == (pointer)0x0) {
        IVar13.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       *)0x0;
      }
      uVar5 = *(ulong *)((long)&((IVar13.node)->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                ).
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_ + 0x30);
      if (uVar5 >> 0x3d == 3) {
        if (*(long *)((long)&((IVar13.node)->
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                             ).
                             super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                             .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                             data_ + 0x20) <= now.__r) {
          if (expired !=
              (vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *)0x0) {
            uVar7 = *(undefined8 *)
                     &((IVar13.node)->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      ).
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_;
            local_60.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((long)&((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  8);
            local_60.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((long)&((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x10);
            local_60.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)
                  ((long)&((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x18);
            local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_ = SUB87(uVar7,0);
            local_60.m_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)uVar7 >> 0x38)
            ;
            local_60.m_is_wtxid = (bool)((byte)(uVar5 >> 0x3c) & 1);
            std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>::
            emplace_back<long_const&,GenTxid>
                      ((vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>> *)
                       expired,(long *)(((IVar13.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_.buf + 0x28),&local_60);
          }
          MakeCompleted(this,IVar13);
          goto LAB_003e907b;
        }
LAB_003e924f:
        do {
          poVar11 = &(((this->m_index).
                       super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      .member)->
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                     ).
                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                     .
                     super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
          ;
          local_60.m_is_wtxid = SUB81(poVar11,0);
          local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_ = SUB87((ulong)poVar11 >> 8,0)
          ;
          boost::multi_index::detail::
          ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
          ::decrement((pointer *)&local_60);
          IVar13.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         *)(CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_,
                                     local_60.m_is_wtxid) + -0x38);
          if (CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_,
                       local_60.m_is_wtxid) == 0) {
            IVar13.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                           *)0x0;
          }
        } while ((((*(ulong *)((long)&((IVar13.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      ).
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) >> 0x3d) - 1 < 2) &&
                 (now.__r < *(long *)((long)&((IVar13.node)->
                                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                             ).
                                             super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                             .
                                             super_pod_value_holder<(anonymous_namespace)::Announcement>
                                             .space.data_ + 0x20))) &&
                (ChangeAndReselect(this,IVar13,CANDIDATE_DELAYED), (this->m_index).node_count != 0))
        ;
        break;
      }
      if (((uint)(uVar5 >> 0x3d) != 0) ||
         (now.__r < *(long *)((long)&((IVar13.node)->
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                     ).
                                     super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                     .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                     space.data_ + 0x20))) goto LAB_003e924f;
      if (poVar3 == (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                     *)IVar13.node) {
        __assert_fail("it != m_index.get<ByTxHash>().end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                      ,0x193,"void TxRequestTracker::Impl::PromoteCandidateReady(Iter<ByTxHash>)");
      }
      if (0x1fffffffffffffff < uVar5) {
        __assert_fail("it->GetState() == State::CANDIDATE_DELAYED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                      ,0x194,"void TxRequestTracker::Impl::PromoteCandidateReady(Iter<ByTxHash>)");
      }
      p_Var6 = *(_Hash_node_base **)
                ((long)&((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                0x28);
      for (p_Var12 = (this->m_peerinfo)._M_h._M_buckets
                     [(ulong)p_Var6 % (this->m_peerinfo)._M_h._M_bucket_count]->_M_nxt;
          p_Var12[1]._M_nxt != p_Var6; p_Var12 = p_Var12->_M_nxt) {
      }
      *(ulong *)((long)&((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                0x30) = uVar5 + 0x2000000000000000;
      bVar8 = boost::multi_index::detail::
              ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
              ::modify_(&this_00->super_type,(index_node_type *)IVar13.node);
      if (!bVar8) {
        operator_delete(IVar13.node,0x80);
        psVar1 = &(this->m_index).node_count;
        *psVar1 = *psVar1 - 1;
      }
      p_Var12[3]._M_nxt =
           (_Hash_node_base *)
           ((long)&(p_Var12[3]._M_nxt)->_M_nxt +
           (ulong)((*(ulong *)((long)&((IVar13.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      ).
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x8000000000000000));
      p_Var12[4]._M_nxt =
           (_Hash_node_base *)
           ((long)&(p_Var12[4]._M_nxt)->_M_nxt +
           (ulong)((*(ulong *)((long)&((IVar13.node)->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      ).
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x6000000000000000));
      local_60.m_is_wtxid =
           SUB81(&(IVar13.node)->
                  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                 ,0);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_ =
           SUB87((ulong)&(IVar13.node)->
                         super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                 >> 8,0);
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_60);
      x = (index_node_type *)
          CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_,local_60.m_is_wtxid);
      if (x != (index_node_type *)0x0) {
        x = (index_node_type *)
            (&x[-1].
              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
              .
              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
              .
              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.align_ + 6);
      }
      if ((x == (this->m_index).
                super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                .member) ||
         (auVar15[0] = -(((IVar13.node)->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         ).
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0] ==
                        (x->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                        ).
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        .
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0]),
         auVar15[1] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [1] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[1]),
         auVar15[2] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [2] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[2]),
         auVar15[3] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [3] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[3]),
         auVar15[4] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [4] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[4]),
         auVar15[5] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [5] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[5]),
         auVar15[6] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [6] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[6]),
         auVar15[7] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [7] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[7]),
         auVar15[8] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [8] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[8]),
         auVar15[9] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [9] == (x->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                               ).
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               .
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_.buf[9]),
         auVar15[10] = -(((IVar13.node)->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         ).
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[10] ==
                        (x->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                        ).
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        .
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [10]),
         auVar15[0xb] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0xb] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0xb]),
         auVar15[0xc] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0xc] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0xc]),
         auVar15[0xd] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0xd] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0xd]),
         auVar15[0xe] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0xe] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0xe]),
         auVar15[0xf] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0xf] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0xf]),
         auVar14[0] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x10] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x10]),
         auVar14[1] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x11] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x11]),
         auVar14[2] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x12] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x12]),
         auVar14[3] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x13] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x13]),
         auVar14[4] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x14] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x14]),
         auVar14[5] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x15] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x15]),
         auVar14[6] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x16] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x16]),
         auVar14[7] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x17] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x17]),
         auVar14[8] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x18] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x18]),
         auVar14[9] = -(((IVar13.node)->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        ).
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x19] ==
                       (x->
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                       ).
                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                       .
                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                       [0x19]),
         auVar14[10] = -(((IVar13.node)->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         ).
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0x1a] ==
                        (x->
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                        ).
                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                        .
                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                        .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.buf
                        [0x1a]),
         auVar14[0xb] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0x1b] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0x1b]),
         auVar14[0xc] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0x1c] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0x1c]),
         auVar14[0xd] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0x1d] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0x1d]),
         auVar14[0xe] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0x1e] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0x1e]),
         auVar14[0xf] = -(((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                          buf[0x1f] ==
                         (x->
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                         ).
                         super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                         .
                         super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                         .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                         buf[0x1f]), auVar14 = auVar14 & auVar15,
         (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff)) {
LAB_003e8f99:
        p_Var6 = *(_Hash_node_base **)
                  ((long)&((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x28);
        for (p_Var12 = (this->m_peerinfo)._M_h._M_buckets
                       [(ulong)p_Var6 % (this->m_peerinfo)._M_h._M_bucket_count]->_M_nxt;
            p_Var12[1]._M_nxt != p_Var6; p_Var12 = p_Var12->_M_nxt) {
        }
        p_Var12[3]._M_nxt =
             (_Hash_node_base *)
             ((long)p_Var12[3]._M_nxt -
             (ulong)((*(ulong *)((long)&((IVar13.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x8000000000000000));
        p_Var12[4]._M_nxt =
             (_Hash_node_base *)
             ((long)p_Var12[4]._M_nxt -
             (ulong)((*(ulong *)((long)&((IVar13.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000));
        *(ulong *)((long)&((IVar13.node)->
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                          ).
                          super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                          .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_ +
                  0x30) =
             *(ulong *)((long)&((IVar13.node)->
                               super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                               ).
                               super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                               .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                               data_ + 0x30) & 0x1fffffffffffffff | 0x4000000000000000;
        bVar8 = boost::multi_index::detail::
                ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                ::modify_(&this_00->super_type,(index_node_type *)IVar13.node);
LAB_003e9025:
        if (bVar8 == false) {
          operator_delete(IVar13.node,0x80);
          psVar1 = &(this->m_index).node_count;
          *psVar1 = *psVar1 - 1;
        }
        p_Var12[3]._M_nxt =
             (_Hash_node_base *)
             ((long)&(p_Var12[3]._M_nxt)->_M_nxt +
             (ulong)((*(ulong *)((long)&((IVar13.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x8000000000000000));
        p_Var12[4]._M_nxt =
             (_Hash_node_base *)
             ((long)&(p_Var12[4]._M_nxt)->_M_nxt +
             (ulong)((*(ulong *)((long)&((IVar13.node)->
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                        ).
                                        super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                        .super_pod_value_holder<(anonymous_namespace)::Announcement>
                                        .space.data_ + 0x30) & 0xe000000000000000) ==
                    0x6000000000000000));
      }
      else {
        uVar5 = *(ulong *)((long)&(x->
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                  ).
                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                  .
                                  super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                  .super_pod_value_holder<(anonymous_namespace)::Announcement>.space
                                  .data_ + 0x30);
        if (uVar5 >> 0x3d == 2) {
          PVar9 = anon_unknown.dwarf_11fd785::PriorityComputer::operator()
                            ((PriorityComputer *)(this->m_computer).m_k0,
                             (uint256 *)(this->m_computer).m_k1,(NodeId)x,
                             SUB81(*(undefined8 *)
                                    ((long)&(x->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x28),0));
          PVar10 = anon_unknown.dwarf_11fd785::PriorityComputer::operator()
                             ((PriorityComputer *)(this->m_computer).m_k0,
                              (uint256 *)(this->m_computer).m_k1,(NodeId)IVar13.node,
                              SUB81(*(undefined8 *)
                                     ((long)&((IVar13.node)->
                                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                             ).
                                             super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                             .
                                             super_pod_value_holder<(anonymous_namespace)::Announcement>
                                             .space.data_ + 0x28),0));
          if (PVar9 < PVar10) {
            p_Var6 = *(_Hash_node_base **)
                      ((long)&(x->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                              ).
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              .
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_ + 0x28);
            for (p_Var12 = (this->m_peerinfo)._M_h._M_buckets
                           [(ulong)p_Var6 % (this->m_peerinfo)._M_h._M_bucket_count]->_M_nxt;
                p_Var12[1]._M_nxt != p_Var6; p_Var12 = p_Var12->_M_nxt) {
            }
            p_Var12[3]._M_nxt =
                 (_Hash_node_base *)
                 ((long)p_Var12[3]._M_nxt -
                 (ulong)((*(ulong *)((long)&(x->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x8000000000000000));
            p_Var12[4]._M_nxt =
                 (_Hash_node_base *)
                 ((long)p_Var12[4]._M_nxt -
                 (ulong)((*(ulong *)((long)&(x->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x6000000000000000));
            *(ulong *)((long)&(x->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                              ).
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              .
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_ + 0x30) =
                 (*(ulong *)((long)&(x->
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                    ).
                                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                    .
                                    super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                    .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                    space.data_ + 0x30) & 0x1fffffffffffffff) + 0x2000000000000000;
            bVar8 = boost::multi_index::detail::
                    ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                    ::modify_(&this_00->super_type,x);
            if (!bVar8) {
              operator_delete(x,0x80);
              psVar1 = &(this->m_index).node_count;
              *psVar1 = *psVar1 - 1;
            }
            p_Var12[3]._M_nxt =
                 (_Hash_node_base *)
                 ((long)&(p_Var12[3]._M_nxt)->_M_nxt +
                 (ulong)((*(ulong *)((long)&(x->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x8000000000000000));
            p_Var12[4]._M_nxt =
                 (_Hash_node_base *)
                 ((long)&(p_Var12[4]._M_nxt)->_M_nxt +
                 (ulong)((*(ulong *)((long)&(x->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x6000000000000000));
            p_Var6 = *(_Hash_node_base **)
                      ((long)&((IVar13.node)->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              ).
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_ + 0x28);
            for (p_Var12 = (this->m_peerinfo)._M_h._M_buckets
                           [(ulong)p_Var6 % (this->m_peerinfo)._M_h._M_bucket_count]->_M_nxt;
                p_Var12[1]._M_nxt != p_Var6; p_Var12 = p_Var12->_M_nxt) {
            }
            p_Var12[3]._M_nxt =
                 (_Hash_node_base *)
                 ((long)p_Var12[3]._M_nxt -
                 (ulong)((*(ulong *)((long)&((IVar13.node)->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            ).
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x8000000000000000));
            p_Var12[4]._M_nxt =
                 (_Hash_node_base *)
                 ((long)p_Var12[4]._M_nxt -
                 (ulong)((*(ulong *)((long)&((IVar13.node)->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            ).
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x6000000000000000));
            *(ulong *)((long)&((IVar13.node)->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              ).
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_ + 0x30) =
                 *(ulong *)((long)&((IVar13.node)->
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                   ).
                                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                   space.data_ + 0x30) & 0x1fffffffffffffff | 0x4000000000000000;
            bVar8 = boost::multi_index::detail::
                    ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                    ::modify_(&this_00->super_type,(index_node_type *)IVar13.node);
            goto LAB_003e9025;
          }
        }
        else if ((uint)(uVar5 >> 0x3d) == 4) goto LAB_003e8f99;
      }
LAB_003e907b:
    } while ((this->m_index).node_count != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SetTimePoint(std::chrono::microseconds now, std::vector<std::pair<NodeId, GenTxid>>* expired)
    {
        if (expired) expired->clear();

        // Iterate over all CANDIDATE_DELAYED and REQUESTED from old to new, as long as they're in the past,
        // and convert them to CANDIDATE_READY and COMPLETED respectively.
        while (!m_index.empty()) {
            auto it = m_index.get<ByTime>().begin();
            if (it->GetState() == State::CANDIDATE_DELAYED && it->m_time <= now) {
                PromoteCandidateReady(m_index.project<ByTxHash>(it));
            } else if (it->GetState() == State::REQUESTED && it->m_time <= now) {
                if (expired) expired->emplace_back(it->m_peer, ToGenTxid(*it));
                MakeCompleted(m_index.project<ByTxHash>(it));
            } else {
                break;
            }
        }

        while (!m_index.empty()) {
            // If time went backwards, we may need to demote CANDIDATE_BEST and CANDIDATE_READY announcements back
            // to CANDIDATE_DELAYED. This is an unusual edge case, and unlikely to matter in production. However,
            // it makes it much easier to specify and test TxRequestTracker::Impl's behaviour.
            auto it = std::prev(m_index.get<ByTime>().end());
            if (it->IsSelectable() && it->m_time > now) {
                ChangeAndReselect(m_index.project<ByTxHash>(it), State::CANDIDATE_DELAYED);
            } else {
                break;
            }
        }
    }